

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O0

void __thiscall
wabt::intrusive_list<wabt::Expr>::intrusive_list
          (intrusive_list<wabt::Expr> *this,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *node)

{
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_20;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *local_18;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *node_local;
  intrusive_list<wabt::Expr> *this_local;
  
  this->first_ = (Expr *)0x0;
  this->last_ = (Expr *)0x0;
  this->size_ = 0;
  local_18 = node;
  node_local = (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)this;
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::unique_ptr(&local_20,node);
  push_back(this,&local_20);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_20);
  return;
}

Assistant:

inline intrusive_list<T>::intrusive_list(std::unique_ptr<T> node) {
  push_back(std::move(node));
}